

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

iter_type __thiscall
booster::locale::impl_posix::time_put_posix<wchar_t>::do_put
          (time_put_posix<wchar_t> *this,iter_type out,ios_base *param_3,wchar_t param_4,tm *tm,
          char format,char modifier)

{
  ulong uVar1;
  wchar_t *pwVar2;
  ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> *this_00;
  undefined1 in_DL;
  undefined8 extraout_RDX;
  streambuf_type *in_RSI;
  iter_type iVar3;
  uint i;
  string_type res;
  char_type_conflict fmt [4];
  __shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffff00;
  wchar_t __c;
  undefined4 *local_c0;
  uint local_7c;
  locale_t in_stack_ffffffffffffff88;
  tm *in_stack_ffffffffffffff90;
  wchar_t *in_stack_ffffffffffffff98;
  undefined4 local_4c [9];
  ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> local_28;
  streambuf_type *local_18;
  undefined1 uStack_10;
  
  local_c0 = local_4c;
  local_28._M_sbuf = in_RSI;
  local_28._M_failed = (bool)in_DL;
  do {
    *local_c0 = 0;
    local_c0 = local_c0 + 1;
  } while (local_c0 != local_4c + 1);
  std::__shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            (in_stack_ffffffffffffff00);
  ftime_traits<wchar_t>::ftime_abi_cxx11_
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  for (local_7c = 0; uVar1 = std::__cxx11::wstring::size(), local_7c < uVar1;
      local_7c = local_7c + 1) {
    pwVar2 = (wchar_t *)std::__cxx11::wstring::operator[]((ulong)&stack0xffffffffffffff88);
    __c = *pwVar2;
    this_00 = std::ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::operator++(&local_28,0)
    ;
    std::ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::operator*(this_00);
    std::ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::operator=(this_00,__c);
  }
  uStack_10 = local_28._M_failed;
  local_18 = local_28._M_sbuf;
  std::__cxx11::wstring::~wstring((wstring *)&stack0xffffffffffffff88);
  iVar3._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  iVar3._M_failed = (bool)uStack_10;
  iVar3._M_sbuf = local_18;
  return iVar3;
}

Assistant:

virtual iter_type do_put(iter_type out,std::ios_base &/*ios*/,CharType /*fill*/,std::tm const *tm,char format,char modifier) const
    {
        char_type fmt[4] = { '%' , modifier != 0 ? modifier : format , modifier == 0 ? '\0' : format };
        string_type res = ftime_traits<char_type>::ftime(fmt,tm,*lc_);
        for(unsigned i=0;i<res.size();i++)
            *out++ = res[i];
        return out;
    }